

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

void cs::process_context::cleanup_context(void)

{
  bool bVar1;
  stack_type<cs_impl::any,_std::allocator> *in_stack_00000040;
  
  while( true ) {
    bVar1 = stack_type<cs_impl::any,_std::allocator>::empty
                      ((stack_type<cs_impl::any,_std::allocator> *)(current_process + 0x80));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    stack_type<cs_impl::any,_std::allocator>::pop_no_return(in_stack_00000040);
  }
  return;
}

Assistant:

void process_context::cleanup_context()
	{
		while (!current_process->stack.empty())
			current_process->stack.pop_no_return();
#ifdef CS_DEBUGGER
		while(!current_process->stack_backtrace.empty())
			current_process->stack_backtrace.pop_no_return();
#endif
	}